

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O0

void DirectionalLight_set(void *super,Vec3fa *direction,Vec3fa *radiance,float cosAngle)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *in_RDX;
  undefined1 (*in_RSI) [16];
  long in_RDI;
  float in_XMM0_Da;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  DirectionalLight *self;
  Vec3fa dy;
  Vec3fa dx;
  Vec3fa dx1;
  Vec3fa dx0;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_4;
  vfloat4 b_3;
  vfloat4 a_4;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  __m128 mask;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 c_3;
  __m128 r;
  __m128 a_3;
  __m128 c_5;
  __m128 r_1;
  __m128 a_5;
  float local_168c;
  ulong local_1688;
  ulong uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined1 local_1668 [16];
  undefined8 local_1658;
  undefined8 uStack_1650;
  long local_1648;
  undefined8 *local_1618;
  undefined1 *local_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  ulong local_15e8;
  ulong uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  ulong local_15c8;
  ulong uStack_15c0;
  ulong local_15b8;
  ulong uStack_15b0;
  undefined8 *local_15a0;
  ulong local_1598;
  ulong uStack_1590;
  ulong *local_1588;
  ulong *local_1580;
  long local_1578;
  ulong uStack_1570;
  ulong *local_1568;
  ulong *local_1560;
  undefined8 *local_1558;
  undefined8 *local_1550;
  undefined8 *local_1548;
  undefined8 *local_1540;
  undefined1 *local_1538;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined8 *local_1520;
  float local_1514;
  undefined4 local_1510;
  float local_150c;
  ulong *local_1508;
  float local_14fc;
  float local_14f8;
  undefined4 local_14f4;
  ulong *local_14f0;
  ulong local_14e8;
  ulong uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  ulong local_14a8;
  ulong uStack_14a0;
  ulong *local_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  long local_1448;
  ulong uStack_1440;
  long *local_1430;
  ulong *local_1428;
  ulong *local_1420;
  ulong *local_1418;
  ulong *local_1410;
  ulong *local_1408;
  long *local_1400;
  long local_13f8;
  ulong uStack_13f0;
  long *local_13e0;
  ulong local_13d8;
  ulong uStack_13d0;
  ulong *local_13c0;
  long *local_13b8;
  undefined8 *local_13b0;
  ulong *local_13a8;
  undefined8 *local_13a0;
  long *local_1398;
  undefined8 *local_1390;
  ulong *local_1388;
  undefined8 *local_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 *local_1350;
  undefined8 *local_1348;
  undefined8 *local_1340;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  undefined8 *local_1328;
  undefined8 *local_1320;
  long *local_1318;
  undefined8 *local_1310;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  undefined8 *local_12f8;
  undefined8 *local_12f0;
  ulong *local_12e8;
  undefined8 *local_12e0;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  undefined8 *local_12c8;
  undefined8 *local_12c0;
  ulong *local_12b8;
  ulong *local_12b0;
  float local_12a8;
  undefined4 uStack_12a4;
  float fStack_12a0;
  undefined4 uStack_129c;
  ulong *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  ulong *local_1278;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  long *local_1248;
  undefined8 *local_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 *local_1220;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined4 local_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  long local_11f8;
  ulong uStack_11f0;
  ulong local_11e8;
  ulong uStack_11e0;
  long *local_11d8;
  ulong *local_11d0;
  undefined8 *local_11c8;
  ulong *local_11c0;
  undefined8 *local_11b8;
  ulong *local_11b0;
  undefined8 *local_11a8;
  long *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  ulong *local_1188;
  undefined8 *local_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 *local_1160;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  ulong local_1148;
  ulong uStack_1140;
  ulong *local_1130;
  long *local_1128;
  undefined8 *local_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 *local_1100;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  long local_10e8;
  ulong uStack_10e0;
  long *local_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  long local_1078;
  ulong uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  undefined4 local_1008;
  float fStack_1004;
  float fStack_1000;
  undefined4 uStack_ffc;
  long *local_ff0;
  float local_fe8;
  undefined4 uStack_fe4;
  float fStack_fe0;
  undefined4 uStack_fdc;
  ulong *local_fd0;
  ulong local_fc8;
  ulong uStack_fc0;
  undefined4 local_fb8;
  float local_fb4;
  float local_fb0;
  undefined4 local_fac;
  ulong local_fa8;
  ulong uStack_fa0;
  float local_f98;
  undefined4 local_f94;
  float local_f90;
  undefined4 local_f8c;
  undefined8 *local_f88;
  undefined8 *local_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 *local_f68;
  undefined8 *local_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  float local_f3c;
  undefined8 *local_f38;
  undefined8 *local_f30;
  float local_f24;
  undefined8 *local_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 *local_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined8 *local_ea8;
  undefined8 *local_ea0;
  undefined8 *local_e98;
  undefined8 *local_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 *local_e70;
  undefined8 *local_e68;
  undefined8 *local_e60;
  undefined8 *local_e58;
  undefined8 *local_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  float local_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  undefined8 *local_e08;
  undefined8 *local_e00;
  undefined8 *local_df8;
  undefined8 *local_df0;
  float local_de8;
  float fStack_de4;
  float fStack_de0;
  float fStack_ddc;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 *local_da0;
  float local_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 *local_d70;
  undefined8 *local_d68;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 *local_d20;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 *local_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  undefined8 *local_c50;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  undefined8 *local_c30;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  ulong *local_c08;
  undefined8 *local_c00;
  undefined8 local_bf8;
  ulong uStack_bf0;
  ulong *local_be8;
  ulong *local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  float local_bbc;
  ulong *local_bb8;
  undefined8 *local_bb0;
  float local_ba4;
  undefined8 *local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  ulong uStack_b50;
  undefined8 *local_b40;
  undefined8 *local_b38;
  ulong *local_b30;
  undefined8 *local_b28;
  ulong *local_b20;
  ulong *local_b18;
  undefined8 *local_b10;
  undefined8 local_b08;
  ulong uStack_b00;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined8 *local_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined8 *local_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 *local_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  ulong uStack_a00;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 *local_9a0;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  undefined8 local_988;
  ulong uStack_980;
  undefined8 *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  ulong uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  ulong uStack_920;
  undefined8 local_918;
  ulong uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  undefined4 uStack_8dc;
  undefined8 *local_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 *local_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_88c;
  ulong local_888;
  ulong uStack_880;
  ulong *local_878;
  ulong *local_870;
  undefined1 local_861;
  ulong *local_860;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  ulong local_848;
  ulong uStack_840;
  ulong *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined1 local_7c8 [16];
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 *local_790;
  undefined8 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 *local_760;
  undefined1 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 *local_720;
  undefined1 *local_708;
  undefined8 *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 *local_6e0;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  ulong local_6b8;
  undefined8 uStack_6b0;
  undefined1 local_6a8 [16];
  ulong local_698;
  undefined8 uStack_690;
  float local_67c;
  ulong local_678;
  undefined8 uStack_670;
  undefined1 local_668 [16];
  undefined4 local_64c;
  undefined1 local_648 [16];
  undefined4 local_62c;
  undefined1 local_628 [16];
  float local_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  ulong local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  ulong local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  ulong local_578;
  undefined8 uStack_570;
  ulong local_568;
  undefined8 uStack_560;
  undefined1 local_558 [16];
  ulong local_548;
  undefined8 uStack_540;
  float local_52c;
  ulong local_528;
  undefined8 uStack_520;
  undefined1 local_518 [16];
  undefined4 local_4fc;
  undefined1 local_4f8 [16];
  undefined4 local_4dc;
  undefined1 local_4d8 [16];
  float local_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  ulong local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  ulong local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  ulong local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_220;
  undefined1 *local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 *local_e0;
  undefined1 *local_d8;
  undefined8 *local_d0;
  float fStack_c4;
  float fStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_15a0 = &local_1678;
  local_14f8 = *(float *)(*in_RSI + 8);
  local_14fc = -*(float *)(*in_RSI + 4);
  local_1568 = &local_15b8;
  local_14f4 = 0;
  local_fac = 0;
  local_fb8 = 0;
  local_1048 = (ulong)(uint)local_14f8 << 0x20;
  uStack_1040 = (ulong)(uint)local_14fc;
  local_150c = -*(float *)(*in_RSI + 8);
  local_1514 = *(float *)*in_RSI;
  local_1588 = &local_15c8;
  local_1510 = 0;
  local_f8c = 0;
  local_f94 = 0;
  local_1028 = (ulong)(uint)local_150c;
  uStack_1020 = (ulong)(uint)local_1514;
  local_1430 = &local_1578;
  local_1008 = 0;
  local_1218 = local_14f8 * local_14f8;
  local_10f8 = local_14fc * local_14fc;
  uStack_ffc = 0;
  local_13f8 = (ulong)(uint)local_1218 << 0x20;
  uStack_13f0 = (ulong)(uint)local_10f8;
  local_13e0 = &local_1448;
  local_13b0 = &local_1458;
  local_1238 = CONCAT44(local_1218,local_1218);
  uStack_1230 = CONCAT44(local_1218,local_1218);
  local_1390 = &local_1468;
  local_1118 = CONCAT44(local_10f8,local_10f8);
  uStack_1110 = CONCAT44(local_10f8,local_10f8);
  local_1348 = &local_1488;
  local_1308 = local_1218 + 0.0;
  fStack_1304 = local_1218 + local_1218;
  fStack_1300 = local_10f8 + local_1218;
  fStack_12fc = local_1218 + 0.0;
  local_1058 = CONCAT44(fStack_1304,local_1308);
  uStack_1050 = CONCAT44(fStack_12fc,fStack_1300);
  local_1340 = &local_1478;
  local_1338 = local_1308 + local_10f8;
  fStack_1334 = fStack_1304 + local_10f8;
  fStack_1330 = fStack_1300 + local_10f8;
  fStack_132c = fStack_12fc + local_10f8;
  local_1378 = CONCAT44(fStack_1334,local_1338);
  uStack_1370 = CONCAT44(fStack_132c,fStack_1330);
  local_1490 = &local_1598;
  local_fe8 = local_150c * local_150c;
  local_1208 = 0;
  local_1158 = local_1514 * local_1514;
  uStack_fdc = 0;
  local_13d8 = (ulong)(uint)local_fe8;
  uStack_13d0 = (ulong)(uint)local_1158;
  local_13c0 = &local_14a8;
  local_13a0 = &local_14b8;
  local_1268 = 0;
  uStack_1260 = 0;
  local_1380 = &local_14c8;
  local_1178 = CONCAT44(local_1158,local_1158);
  uStack_1170 = CONCAT44(local_1158,local_1158);
  local_12e8 = &local_14e8;
  local_12a8 = local_fe8 + 0.0;
  uStack_12a4 = 0;
  fStack_12a0 = local_1158 + 0.0;
  uStack_129c = 0;
  local_1098 = (ulong)(uint)local_12a8;
  uStack_1090 = (ulong)(uint)fStack_12a0;
  local_12e0 = &local_14d8;
  local_12d8 = local_12a8 + local_1158;
  fStack_12d4 = local_1158 + 0.0;
  fStack_12d0 = fStack_12a0 + local_1158;
  fStack_12cc = local_1158 + 0.0;
  local_1368 = CONCAT44(fStack_12d4,local_12d8);
  uStack_1360 = CONCAT44(fStack_12cc,fStack_12d0);
  local_861 = local_12d8 < local_1338;
  local_860 = &local_15e8;
  local_870 = &local_15b8;
  local_878 = &local_15c8;
  if ((bool)local_861) {
    local_388 = 0;
    uStack_380 = 0;
    local_398 = 0;
    uStack_390 = 0;
    local_3a8 = 0;
    uStack_3a0 = 0;
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_858 = 0xffffffff;
    uStack_854 = 0xffffffff;
    uStack_850 = 0xffffffff;
    uStack_84c = 0xffffffff;
    local_1688 = 0xffffffffffffffff;
    uStack_1680 = 0xffffffffffffffff;
  }
  else {
    local_378 = 0;
    uStack_370 = 0;
    local_1688 = 0;
    uStack_1680 = 0;
  }
  local_888 = local_1688;
  uStack_880 = uStack_1680;
  local_368 = local_1688;
  uStack_360 = uStack_1680;
  local_308 = local_1688;
  uStack_300 = uStack_1680;
  local_328 = local_1688 & local_1048;
  uStack_320 = uStack_1680 & uStack_1040;
  local_2e8 = local_1688;
  uStack_2e0 = uStack_1680;
  local_338 = ~local_1688 & local_1028;
  uStack_330 = ~uStack_1680 & uStack_1020;
  local_928 = local_328 | local_338;
  uStack_920 = uStack_320 | uStack_330;
  local_c08 = &local_15e8;
  local_c00 = &local_15d8;
  local_b40 = &local_bf8;
  local_918._0_4_ = (float)local_338;
  local_918._4_4_ = (float)(local_328 >> 0x20);
  uStack_910._0_4_ = (float)uStack_920;
  local_8e8 = (float)local_918 * (float)local_918;
  local_a18 = local_918._4_4_ * local_918._4_4_;
  local_998 = (float)uStack_910 * (float)uStack_910;
  uStack_8dc = 0;
  local_b08 = CONCAT44(local_a18,local_8e8);
  uStack_b00 = (ulong)(uint)local_998;
  local_af0 = &local_b58;
  local_ae0 = &local_b68;
  local_a38 = CONCAT44(local_a18,local_a18);
  uStack_a30 = CONCAT44(local_a18,local_a18);
  local_ad0 = &local_b78;
  local_9b8 = CONCAT44(local_998,local_998);
  uStack_9b0 = CONCAT44(local_998,local_998);
  local_aa8 = &local_b98;
  local_a68 = local_8e8 + local_a18;
  fStack_a64 = local_a18 + local_a18;
  fStack_a60 = local_998 + local_a18;
  fStack_a5c = local_a18 + 0.0;
  local_938 = CONCAT44(fStack_a64,local_a68);
  uStack_930 = CONCAT44(fStack_a5c,fStack_a60);
  local_aa0 = &local_b88;
  local_a98 = local_a68 + local_998;
  fStack_a94 = fStack_a64 + local_998;
  fStack_a90 = fStack_a60 + local_998;
  fStack_a8c = fStack_a5c + local_998;
  local_ac8 = CONCAT44(fStack_a94,local_a98);
  uStack_ac0 = CONCAT44(fStack_a8c,fStack_a90);
  local_628 = ZEXT416((uint)local_a98);
  local_698 = CONCAT44(0,local_a98);
  uStack_690 = 0;
  uStack_400 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_698;
  local_6a8 = rsqrtss(auVar3,auVar3);
  local_62c = 0x3fc00000;
  local_648 = ZEXT416(0x3fc00000);
  local_588 = local_6a8._0_8_;
  uVar6 = local_588;
  uStack_580 = local_6a8._8_8_;
  local_588._0_4_ = local_6a8._0_4_;
  local_578 = (ulong)(uint)((float)local_588 * 1.5);
  uStack_570 = 0;
  local_64c = 0xbf000000;
  local_668 = ZEXT416(0xbf000000);
  local_5a8 = local_668._0_8_;
  uStack_5a0 = 0;
  local_598 = (ulong)(uint)(local_a98 * -0.5);
  uStack_590 = 0;
  local_5c8 = local_6a8._0_8_;
  uStack_5c0 = local_6a8._8_8_;
  local_bbc = local_a98 * -0.5 * (float)local_588;
  local_5b8 = (ulong)(uint)local_bbc;
  uStack_5b0 = 0;
  local_5e8 = local_6a8._0_8_;
  uStack_5e0 = local_6a8._8_8_;
  local_5d8 = CONCAT44(local_6a8._4_4_,(float)local_588 * (float)local_588);
  uStack_5d0 = local_6a8._8_8_;
  local_608 = local_5d8;
  uStack_600 = local_6a8._8_8_;
  local_bbc = local_bbc * (float)local_588 * (float)local_588;
  local_5f8 = (ulong)(uint)local_bbc;
  uStack_5f0 = 0;
  local_3d8 = local_5f8;
  uStack_3d0 = 0;
  local_bbc = (float)local_588 * 1.5 + local_bbc;
  local_3c8 = (ulong)(uint)local_bbc;
  uStack_3c0 = 0;
  local_6b8 = local_3c8;
  uStack_6b0 = 0;
  local_678 = local_3c8;
  uStack_670 = 0;
  local_ba0 = &local_bd8;
  local_908 = CONCAT44(local_bbc,local_bbc);
  uStack_900 = CONCAT44(local_bbc,local_bbc);
  local_8c8 = (float)local_918 * local_bbc;
  fStack_8c4 = local_918._4_4_ * local_bbc;
  fStack_8c0 = (float)uStack_910 * local_bbc;
  fStack_8bc = local_bbc * 0.0;
  local_1678 = CONCAT44(fStack_8c4,local_8c8);
  uStack_1670 = CONCAT44(fStack_8bc,fStack_8c0);
  local_f88 = &local_1608;
  local_778 = *(undefined8 *)*in_RSI;
  uStack_770 = *(undefined8 *)(*in_RSI + 8);
  local_760 = &local_7a8;
  auVar5._8_8_ = uStack_15d0;
  auVar5._0_8_ = local_15d8;
  local_740 = local_7c8;
  local_210 = &local_7b8;
  fStack_160 = (float)local_15d8;
  auVar8._12_4_ = (float)((ulong)uStack_15d0 >> 0x20);
  auVar8._0_8_ = auVar5._4_8_;
  auVar8._8_4_ = fStack_160;
  local_1e8._8_8_ = auVar8._8_8_;
  uStack_200 = local_1e8._8_8_;
  uStack_7b0 = local_1e8._8_8_;
  local_738 = *(undefined8 *)*in_RSI;
  uStack_730 = *(undefined8 *)(*in_RSI + 8);
  auVar2 = *in_RSI;
  local_720 = &local_7e8;
  local_270 = &local_7d8;
  auVar9._12_4_ = (float)((ulong)uStack_730 >> 0x20);
  auVar9._0_8_ = auVar2._4_8_;
  auVar9._8_4_ = (float)local_738;
  local_248._8_8_ = auVar9._8_8_;
  uStack_260 = local_248._8_8_;
  uStack_7d0 = local_248._8_8_;
  local_708 = local_7f8;
  local_1a0 = &local_828;
  uStack_b0 = local_248._8_8_;
  local_b8._0_4_ = auVar2._4_4_;
  local_b8._4_4_ = auVar2._8_4_;
  fStack_c4 = (float)((ulong)local_15d8 >> 0x20);
  fStack_c0 = (float)uStack_15d0;
  local_f8 = (float)local_b8 * fStack_160;
  fStack_f4 = local_b8._4_4_ * fStack_c4;
  fStack_f0 = (float)local_738 * fStack_c0;
  fStack_ec = auVar9._12_4_ * auVar8._12_4_;
  local_2d8 = &local_818;
  local_170 = &local_1b8;
  uStack_130 = local_1e8._8_8_;
  local_128._0_4_ = (float)local_778;
  local_128._4_4_ = (float)((ulong)local_778 >> 0x20);
  uStack_120._0_4_ = (float)uStack_770;
  uStack_120._4_4_ = (float)((ulong)uStack_770 >> 0x20);
  local_168 = (float)local_128 * fStack_c4;
  fStack_164 = local_128._4_4_ * fStack_c0;
  fStack_160 = (float)uStack_120 * fStack_160;
  fStack_15c = uStack_120._4_4_ * auVar8._12_4_;
  local_48 = CONCAT44(fStack_164,local_168);
  uStack_40 = CONCAT44(fStack_15c,fStack_160);
  local_58 = (float)local_828;
  fStack_54 = (float)((ulong)local_828 >> 0x20);
  fStack_50 = (float)uStack_820;
  fStack_4c = (float)((ulong)uStack_820 >> 0x20);
  local_88 = local_168 - local_58;
  fStack_84 = fStack_164 - fStack_54;
  fStack_80 = fStack_160 - fStack_50;
  auVar10._12_4_ = fStack_15c - fStack_4c;
  local_298 = CONCAT44(fStack_84,local_88);
  uStack_290 = CONCAT44(auVar10._12_4_,fStack_80);
  local_700 = &local_808;
  auVar4._8_8_ = uStack_290;
  auVar4._0_8_ = local_298;
  auVar10._0_8_ = auVar4._4_8_;
  auVar10._8_4_ = local_88;
  local_2a8._8_8_ = auVar10._8_8_;
  uStack_2c0 = local_2a8._8_8_;
  uStack_800 = local_2a8._8_8_;
  uStack_6f0 = local_2a8._8_8_;
  uStack_1600 = local_2a8._8_8_;
  local_f80 = &local_15f8;
  local_ec0 = &local_f78;
  uStack_c90 = local_2a8._8_8_;
  uStack_ca0 = local_2a8._8_8_;
  local_c68 = fStack_84 * fStack_84;
  local_d98 = fStack_80 * fStack_80;
  local_d18 = local_88 * local_88;
  fStack_c5c = auVar10._12_4_ * auVar10._12_4_;
  local_e88 = CONCAT44(local_d98,local_c68);
  uStack_e80 = CONCAT44(fStack_c5c,local_d18);
  local_e70 = &local_ed8;
  local_e60 = &local_ee8;
  local_db8 = CONCAT44(local_d98,local_d98);
  uStack_db0 = CONCAT44(local_d98,local_d98);
  local_e50 = &local_ef8;
  local_d38 = CONCAT44(local_d18,local_d18);
  uStack_d30 = CONCAT44(local_d18,local_d18);
  local_e28 = &local_f18;
  local_de8 = local_c68 + local_d98;
  fStack_de4 = local_d98 + local_d98;
  fStack_de0 = local_d18 + local_d98;
  fStack_ddc = fStack_c5c + local_d98;
  local_cb8 = CONCAT44(fStack_de4,local_de8);
  uStack_cb0 = CONCAT44(fStack_ddc,fStack_de0);
  local_e20 = &local_f08;
  local_e18 = local_de8 + local_d18;
  fStack_e14 = fStack_de4 + local_d18;
  fStack_e10 = fStack_de0 + local_d18;
  fStack_e0c = fStack_ddc + local_d18;
  local_e48 = CONCAT44(fStack_e14,local_e18);
  uStack_e40 = CONCAT44(fStack_e0c,fStack_e10);
  local_4d8 = ZEXT416((uint)local_e18);
  local_548 = CONCAT44(0,local_e18);
  uStack_540 = 0;
  uStack_410 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_548;
  local_558 = rsqrtss(auVar2,auVar2);
  local_4dc = 0x3fc00000;
  local_4f8 = ZEXT416(0x3fc00000);
  local_438 = local_558._0_8_;
  uVar7 = local_438;
  uStack_430 = local_558._8_8_;
  local_438._0_4_ = local_558._0_4_;
  local_428 = (ulong)(uint)((float)local_438 * 1.5);
  uStack_420 = 0;
  local_4fc = 0xbf000000;
  local_518 = ZEXT416(0xbf000000);
  local_458 = local_518._0_8_;
  uStack_450 = 0;
  local_448 = (ulong)(uint)(local_e18 * -0.5);
  uStack_440 = 0;
  local_478 = local_558._0_8_;
  uStack_470 = local_558._8_8_;
  local_f3c = local_e18 * -0.5 * (float)local_438;
  local_468 = (ulong)(uint)local_f3c;
  uStack_460 = 0;
  local_498 = local_558._0_8_;
  uStack_490 = local_558._8_8_;
  local_488 = CONCAT44(local_558._4_4_,(float)local_438 * (float)local_438);
  uStack_480 = local_558._8_8_;
  local_4b8 = local_488;
  uStack_4b0 = local_558._8_8_;
  local_f3c = local_f3c * (float)local_438 * (float)local_438;
  local_4a8 = (ulong)(uint)local_f3c;
  uStack_4a0 = 0;
  local_3f8 = local_4a8;
  uStack_3f0 = 0;
  local_f3c = (float)local_438 * 1.5 + local_f3c;
  local_3e8 = (ulong)(uint)local_f3c;
  uStack_3e0 = 0;
  local_568 = local_3e8;
  uStack_560 = 0;
  local_528 = local_3e8;
  uStack_520 = 0;
  local_f20 = &local_f58;
  local_c88 = CONCAT44(local_f3c,local_f3c);
  uStack_c80 = CONCAT44(local_f3c,local_f3c);
  local_ea8 = &local_15f8;
  local_eb8 = &local_f58;
  uStack_c70 = local_2a8._8_8_;
  local_c48 = fStack_84 * local_f3c;
  fStack_c44 = fStack_80 * local_f3c;
  fStack_c40 = local_88 * local_f3c;
  fStack_c3c = auVar10._12_4_ * local_f3c;
  local_c30 = &local_15f8;
  local_6c0 = &local_1678;
  local_6c8 = &local_15d8;
  local_6d0 = &local_15f8;
  local_18 = local_1668;
  local_28 = &local_1658;
  local_1658 = *(undefined8 *)*in_RSI;
  uStack_1650 = *(undefined8 *)(*in_RSI + 8);
  local_1550 = (undefined8 *)(in_RDI + 0x10);
  local_1558 = &local_1678;
  *local_1550 = local_1678;
  *(undefined8 *)(in_RDI + 0x18) = uStack_1670;
  local_1538 = local_1668;
  local_1530 = (undefined8 *)(in_RDI + 0x20);
  *local_1530 = local_15f8;
  *(undefined8 *)(in_RDI + 0x28) = uStack_15f0;
  local_1548 = &local_1658;
  local_1540 = (undefined8 *)(in_RDI + 0x30);
  *local_1540 = local_1658;
  *(undefined8 *)(in_RDI + 0x38) = uStack_1650;
  local_1618 = (undefined8 *)(in_RDI + 0x40);
  uVar1 = in_RDX[1];
  *local_1618 = *in_RDX;
  *(undefined8 *)(in_RDI + 0x48) = uVar1;
  *(float *)(in_RDI + 0x50) = in_XMM0_Da;
  local_1648 = in_RDI;
  local_1580 = local_1588;
  local_1560 = local_1568;
  local_1528 = local_1558;
  local_1520 = local_1550;
  local_1508 = local_1588;
  local_14f0 = local_1568;
  local_1428 = local_1588;
  local_1420 = local_1588;
  local_1418 = local_1490;
  local_1410 = local_1568;
  local_1408 = local_1568;
  local_1400 = local_1430;
  local_13b8 = local_13e0;
  local_13a8 = local_13c0;
  local_1398 = local_13e0;
  local_1388 = local_13c0;
  local_1350 = local_1390;
  local_1328 = local_1340;
  local_1320 = local_13b0;
  local_1318 = local_13e0;
  local_1310 = local_1348;
  local_12f8 = local_1348;
  local_12f0 = local_1380;
  local_12c8 = local_12e0;
  local_12c0 = local_13a0;
  local_12b8 = local_13c0;
  local_12b0 = local_12e8;
  local_1290 = local_12e8;
  local_1288 = local_1340;
  local_1280 = local_12e0;
  local_1278 = local_13c0;
  local_1270 = local_13a0;
  local_1250 = local_13a0;
  local_1248 = local_13e0;
  local_1240 = local_13b0;
  local_1220 = local_13b0;
  fStack_1214 = local_1218;
  fStack_1210 = local_1218;
  fStack_120c = local_1218;
  uStack_1204 = local_1208;
  uStack_1200 = local_1208;
  uStack_11fc = local_1208;
  local_11f8 = local_13f8;
  uStack_11f0 = uStack_13f0;
  local_11e8 = local_13d8;
  uStack_11e0 = uStack_13d0;
  local_11d8 = local_13e0;
  local_11d0 = local_13c0;
  local_11c8 = local_13a0;
  local_11c0 = local_13c0;
  local_11b8 = local_1380;
  local_11b0 = local_12e8;
  local_11a8 = local_13b0;
  local_11a0 = local_13e0;
  local_1198 = local_1390;
  local_1190 = local_1348;
  local_1188 = local_13c0;
  local_1180 = local_1380;
  local_1160 = local_1380;
  fStack_1154 = local_1158;
  fStack_1150 = local_1158;
  fStack_114c = local_1158;
  local_1148 = local_13d8;
  uStack_1140 = uStack_13d0;
  local_1130 = local_13c0;
  local_1128 = local_13e0;
  local_1120 = local_1390;
  local_1100 = local_1390;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  local_10e8 = local_13f8;
  uStack_10e0 = uStack_13f0;
  local_10d0 = local_13e0;
  local_10c8 = local_1268;
  uStack_10c0 = uStack_1260;
  local_10b8 = local_13d8;
  uStack_10b0 = uStack_13d0;
  local_10a8 = local_1178;
  uStack_10a0 = uStack_1170;
  local_1088 = local_1238;
  uStack_1080 = uStack_1230;
  local_1078 = local_13f8;
  uStack_1070 = uStack_13f0;
  local_1068 = local_1118;
  uStack_1060 = uStack_1110;
  local_1038 = local_1048;
  uStack_1030 = uStack_1040;
  local_1018 = local_1028;
  uStack_1010 = uStack_1020;
  fStack_1004 = local_1218;
  fStack_1000 = local_10f8;
  local_ff0 = local_1430;
  uStack_fe4 = local_1208;
  fStack_fe0 = local_1158;
  local_fd0 = local_1490;
  local_fc8 = local_1048;
  uStack_fc0 = uStack_1040;
  local_fb4 = local_14f8;
  local_fb0 = local_14fc;
  local_fa8 = local_1028;
  uStack_fa0 = uStack_1020;
  local_f98 = local_150c;
  local_f90 = local_1514;
  local_f68 = local_f88;
  local_f60 = local_f88;
  local_f38 = local_f88;
  local_f30 = local_f80;
  local_f24 = local_f3c;
  local_eb0 = local_f88;
  local_ea0 = local_f88;
  local_e98 = local_f88;
  local_e90 = local_ec0;
  local_e68 = local_e70;
  local_e58 = local_e70;
  local_e30 = local_e50;
  local_e08 = local_e20;
  local_e00 = local_e60;
  local_df8 = local_e70;
  local_df0 = local_e28;
  local_dd8 = local_e28;
  local_dd0 = local_e20;
  local_dc8 = local_e70;
  local_dc0 = local_e60;
  local_da0 = local_e60;
  fStack_d94 = local_d98;
  fStack_d90 = local_d98;
  fStack_d8c = local_d98;
  local_d88 = local_e88;
  uStack_d80 = uStack_e80;
  local_d70 = local_e70;
  local_d68 = local_e60;
  local_d60 = local_e70;
  local_d58 = local_e50;
  local_d50 = local_e28;
  local_d48 = local_e70;
  local_d40 = local_e50;
  local_d20 = local_e50;
  fStack_d14 = local_d18;
  fStack_d10 = local_d18;
  fStack_d0c = local_d18;
  local_d08 = local_e88;
  uStack_d00 = uStack_e80;
  local_cf0 = local_e70;
  local_ce8 = local_db8;
  uStack_ce0 = uStack_db0;
  local_cd8 = local_e88;
  uStack_cd0 = uStack_e80;
  local_cc8 = local_d38;
  uStack_cc0 = uStack_d30;
  local_ca8 = auVar10._0_8_;
  local_c98 = auVar10._0_8_;
  local_c78 = auVar10._0_8_;
  fStack_c64 = local_d98;
  fStack_c60 = local_d18;
  local_c50 = local_ec0;
  local_c28 = local_f3c;
  fStack_c24 = local_f3c;
  fStack_c20 = local_f3c;
  fStack_c1c = local_f3c;
  local_c18 = local_f3c;
  local_be8 = local_c08;
  local_be0 = local_c08;
  local_bb8 = local_c08;
  local_bb0 = local_c00;
  local_ba4 = local_bbc;
  local_b38 = local_ba0;
  local_b30 = local_c08;
  local_b28 = local_c00;
  local_b20 = local_c08;
  local_b18 = local_c08;
  local_b10 = local_b40;
  local_ae8 = local_af0;
  local_ad8 = local_af0;
  local_ab0 = local_ad0;
  local_a88 = local_aa0;
  local_a80 = local_ae0;
  local_a78 = local_af0;
  local_a70 = local_aa8;
  local_a58 = local_aa8;
  local_a50 = local_aa0;
  local_a48 = local_af0;
  local_a40 = local_ae0;
  local_a20 = local_ae0;
  fStack_a14 = local_a18;
  fStack_a10 = local_a18;
  fStack_a0c = local_a18;
  local_a08 = local_b08;
  uStack_a00 = uStack_b00;
  local_9f0 = local_af0;
  local_9e8 = local_ae0;
  local_9e0 = local_af0;
  local_9d8 = local_ad0;
  local_9d0 = local_aa8;
  local_9c8 = local_af0;
  local_9c0 = local_ad0;
  local_9a0 = local_ad0;
  fStack_994 = local_998;
  fStack_990 = local_998;
  fStack_98c = local_998;
  local_988 = local_b08;
  uStack_980 = uStack_b00;
  local_970 = local_af0;
  local_968 = local_a38;
  uStack_960 = uStack_a30;
  local_958 = local_b08;
  uStack_950 = uStack_b00;
  local_948 = local_9b8;
  uStack_940 = uStack_9b0;
  local_918 = local_928;
  uStack_910 = uStack_920;
  local_8f8 = local_928;
  uStack_8f0 = uStack_920;
  fStack_8e4 = local_a18;
  fStack_8e0 = local_998;
  local_8d0 = local_b40;
  local_8b0 = local_c00;
  local_8a8 = local_bbc;
  fStack_8a4 = local_bbc;
  fStack_8a0 = local_bbc;
  fStack_89c = local_bbc;
  local_88c = local_bbc;
  local_848 = local_928;
  uStack_840 = uStack_920;
  local_830 = local_c08;
  local_790 = local_c00;
  local_780 = local_f88;
  local_6f8 = auVar10._0_8_;
  local_6e0 = local_f88;
  local_67c = local_a98;
  local_60c = local_a98;
  local_588 = uVar6;
  local_52c = local_e18;
  local_4bc = local_e18;
  local_438 = uVar7;
  local_418 = local_548;
  local_408 = local_698;
  local_358 = local_1048;
  uStack_350 = uStack_1040;
  local_348 = local_1028;
  uStack_340 = uStack_1020;
  local_318 = local_1048;
  uStack_310 = uStack_1040;
  local_2f8 = local_1028;
  uStack_2f0 = uStack_1020;
  local_2d0 = local_700;
  local_2c8 = auVar10._0_8_;
  local_2b0 = local_700;
  local_2a8 = auVar10;
  local_280 = local_2d8;
  local_278 = local_720;
  local_268 = auVar9._0_8_;
  local_250 = local_270;
  local_248 = auVar9;
  local_238 = local_738;
  uStack_230 = uStack_730;
  local_220 = local_720;
  local_218 = local_740;
  local_208 = auVar8._0_8_;
  local_1f0 = local_210;
  local_1e8 = auVar8;
  local_1c0 = local_740;
  local_198 = local_210;
  local_190 = local_760;
  local_188 = local_2d8;
  local_180 = local_210;
  local_178 = local_760;
  local_150 = local_170;
  local_148 = local_210;
  local_140 = local_760;
  local_138 = auVar8._0_8_;
  local_128 = local_778;
  uStack_120 = uStack_770;
  local_110 = local_708;
  local_108 = local_270;
  local_100 = local_1a0;
  local_e0 = local_1a0;
  local_d8 = local_708;
  local_d0 = local_270;
  local_b8 = auVar9._0_8_;
  local_a0 = local_1a0;
  local_98 = local_170;
  local_90 = local_2d8;
  fStack_7c = auVar10._12_4_;
  local_70 = local_2d8;
  local_68 = local_1a0;
  local_60 = local_170;
  local_20 = local_6d0;
  local_10 = local_6c8;
  local_8 = local_6c0;
  local_1608 = auVar10._0_8_;
  local_15f8 = CONCAT44(fStack_c44,local_c48);
  uStack_15f0 = CONCAT44(fStack_c3c,fStack_c40);
  local_15e8 = local_928;
  uStack_15e0 = uStack_920;
  local_15d8 = local_1678;
  uStack_15d0 = uStack_1670;
  local_15c8 = local_1028;
  uStack_15c0 = uStack_1020;
  local_15b8 = local_1048;
  uStack_15b0 = uStack_1040;
  local_1598 = local_13d8;
  uStack_1590 = uStack_13d0;
  local_1578 = local_13f8;
  uStack_1570 = uStack_13f0;
  local_14e8 = local_1098;
  uStack_14e0 = uStack_1090;
  local_14d8 = local_1368;
  uStack_14d0 = uStack_1360;
  local_14c8 = local_1178;
  uStack_14c0 = uStack_1170;
  local_14b8 = local_1268;
  uStack_14b0 = uStack_1260;
  local_14a8 = local_13d8;
  uStack_14a0 = uStack_13d0;
  local_1488 = local_1058;
  uStack_1480 = uStack_1050;
  local_1478 = local_1378;
  uStack_1470 = uStack_1370;
  local_1468 = local_1118;
  uStack_1460 = uStack_1110;
  local_1458 = local_1238;
  uStack_1450 = uStack_1230;
  local_1448 = local_13f8;
  uStack_1440 = uStack_13f0;
  local_f78 = local_e88;
  uStack_f70 = uStack_e80;
  local_f58 = local_c88;
  uStack_f50 = uStack_c80;
  local_f18 = local_cb8;
  uStack_f10 = uStack_cb0;
  local_f08 = local_e48;
  uStack_f00 = uStack_e40;
  local_ef8 = local_d38;
  uStack_ef0 = uStack_d30;
  local_ee8 = local_db8;
  uStack_ee0 = uStack_db0;
  local_ed8 = local_e88;
  uStack_ed0 = uStack_e80;
  local_bf8 = local_b08;
  uStack_bf0 = uStack_b00;
  local_bd8 = local_908;
  uStack_bd0 = uStack_900;
  local_b98 = local_938;
  uStack_b90 = uStack_930;
  local_b88 = local_ac8;
  uStack_b80 = uStack_ac0;
  local_b78 = local_9b8;
  uStack_b70 = uStack_9b0;
  local_b68 = local_a38;
  uStack_b60 = uStack_a30;
  local_b58 = local_b08;
  uStack_b50 = uStack_b00;
  local_828 = CONCAT44(fStack_f4,local_f8);
  uStack_820 = CONCAT44(fStack_ec,fStack_f0);
  local_818 = local_298;
  uStack_810 = uStack_290;
  local_808 = auVar10._0_8_;
  local_7e8 = local_738;
  uStack_7e0 = uStack_730;
  local_7d8 = auVar9._0_8_;
  local_7b8 = auVar8._0_8_;
  local_7a8 = local_778;
  uStack_7a0 = uStack_770;
  local_1b8 = local_48;
  uStack_1b0 = uStack_40;
  if (0.9999999 <= in_XMM0_Da) {
    local_1610 = &embree::inf;
    local_168c = std::numeric_limits<float>::infinity();
  }
  else {
    local_168c = embree::uniformSampleConePDF(in_XMM0_Da);
  }
  *(float *)(local_1648 + 0x54) = local_168c;
  return;
}

Assistant:

void DirectionalLight_set(void* super,
                                 const Vec3fa& direction,
                                 const Vec3fa& radiance,
                                 float cosAngle)
{
  DirectionalLight* self = (DirectionalLight*)super;
  self->frame = frame(direction);
  self->radiance = radiance;
  self->cosAngle = cosAngle;
  self->pdf = cosAngle < COS_ANGLE_MAX ? uniformSampleConePDF(cosAngle) : inf;
}